

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase98::run(TestCase98 *this)

{
  __pid_t _Var1;
  TransformPromiseNodeBase *pTVar2;
  Own<kj::_::PromiseNode> local_a0;
  Own<kj::_::PromiseNode> local_90;
  Promise<int> promise;
  int line;
  WaitScope waitScope;
  Own<kj::_::PromiseNode> local_58;
  EventLoop loop;
  
  EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  _::yield();
  pTVar2 = (TransformPromiseNodeBase *)operator_new(0x28);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar2,&local_90,
             _::
             TransformPromiseNode<int,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:103:7),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  (pTVar2->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00419f98;
  local_a0.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<int,kj::_::Void,kj::(anonymous_namespace)::TestCase98::run()::$_0,kj::_::PropagateException>>
        ::instance;
  local_58.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<int,kj::_::Void,kj::(anonymous_namespace)::TestCase98::run()::$_0,kj::_::PropagateException>>
        ::instance;
  local_a0.ptr = (PromiseNode *)0x0;
  promise.super_PromiseBase.node.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<int,kj::_::Void,kj::(anonymous_namespace)::TestCase98::run()::$_0,kj::_::PropagateException>>
        ::instance;
  local_58.ptr = (PromiseNode *)0x0;
  promise.super_PromiseBase.node.ptr = (PromiseNode *)pTVar2;
  Own<kj::_::PromiseNode>::dispose(&local_58);
  Own<kj::_::PromiseNode>::dispose(&local_a0);
  Own<kj::_::PromiseNode>::dispose(&local_90);
  line = 0x67;
  pTVar2 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar2,(Own<kj::_::PromiseNode> *)&promise,
             _::
             TransformPromiseNode<int,_int,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:107:7),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:108:7)>
             ::anon_class_1_0_00000001_for_func::operator());
  (pTVar2->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0041a020;
  pTVar2[1].dependency.disposer = (Disposer *)&line;
  local_a0.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<int,int,kj::(anonymous_namespace)::TestCase98::run()::$_1,kj::(anonymous_namespace)::TestCase98::run()::$_2>>
        ::instance;
  local_58.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<int,int,kj::(anonymous_namespace)::TestCase98::run()::$_1,kj::(anonymous_namespace)::TestCase98::run()::$_2>>
        ::instance;
  local_a0.ptr = (PromiseNode *)0x0;
  local_90.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<int,int,kj::(anonymous_namespace)::TestCase98::run()::$_1,kj::(anonymous_namespace)::TestCase98::run()::$_2>>
        ::instance;
  local_58.ptr = (PromiseNode *)0x0;
  local_90.ptr = (PromiseNode *)pTVar2;
  Own<kj::_::PromiseNode>::dispose(&local_58);
  Own<kj::_::PromiseNode>::dispose(&local_a0);
  Own<kj::_::PromiseNode>::operator=((Own<kj::_::PromiseNode> *)&promise,&local_90);
  Own<kj::_::PromiseNode>::dispose(&local_90);
  _Var1 = Promise<int>::wait(&promise,&waitScope);
  if ((_Var1 != 0x159) && (_::Debug::minSeverity < 3)) {
    local_a0.disposer = (Disposer *)CONCAT44(local_a0.disposer._4_4_,0x159);
    _Var1 = Promise<int>::wait(&promise,&waitScope);
    local_58.disposer = (Disposer *)CONCAT44(local_58.disposer._4_4_,_Var1);
    _::Debug::log<char_const(&)[52],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x6e,ERROR,
               "\"failed: expected \" \"(345) == (promise.wait(waitScope))\", 345, promise.wait(waitScope)"
               ,(char (*) [52])"failed: expected (345) == (promise.wait(waitScope))",
               (int *)&local_a0,(int *)&local_58);
  }
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&promise);
  WaitScope::~WaitScope(&waitScope);
  EventLoop::~EventLoop(&loop);
  return;
}

Assistant:

TEST(Async, HandleException) {
  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<int> promise = evalLater(
      [&]() -> int { KJ_FAIL_ASSERT("foo") { return 123; } });
  int line = __LINE__ - 1;

  promise = promise.then(
      [](int i) { return i + 1; },
      [&](Exception&& e) { EXPECT_EQ(line, e.getLine()); return 345; });

  EXPECT_EQ(345, promise.wait(waitScope));
}